

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

bool Omega_h::operator==(Graph *a,Graph *b)

{
  bool bVar1;
  Write<int> local_50;
  Write<int> local_40;
  Write<int> local_30;
  Write<int> local_20;
  
  Write<int>::Write(&local_20,(Write<int> *)a);
  Write<int>::Write(&local_30,(Write<int> *)b);
  bVar1 = operator==((Read<int> *)&local_20,(Read<int> *)&local_30);
  if (bVar1) {
    Write<int>::Write(&local_40,&(a->ab2b).write_);
    Write<int>::Write(&local_50,&(b->ab2b).write_);
    bVar1 = operator==((Read<int> *)&local_40,(Read<int> *)&local_50);
    Write<int>::~Write(&local_50);
    Write<int>::~Write(&local_40);
  }
  else {
    bVar1 = false;
  }
  Write<int>::~Write(&local_30);
  Write<int>::~Write(&local_20);
  return bVar1;
}

Assistant:

bool operator==(Graph a, Graph b) {
  return a.a2ab == b.a2ab && a.ab2b == b.ab2b;
}